

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
* __thiscall
chaiscript::ChaiScript_Basic::
eval<std::function<std::__cxx11::string(chaiscript::Boxed_Value_const&)>>
          (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
           *__return_storage_ptr__,ChaiScript_Basic *this,string *t_input,
          Exception_Handler *t_handler,string *t_filename)

{
  undefined1 auStack_28 [16];
  
  eval((ChaiScript_Basic *)auStack_28,(string *)this,(Exception_Handler *)t_input,
       (string *)t_handler);
  detail::Dispatch_Engine::
  boxed_cast<std::function<std::__cxx11::string(chaiscript::Boxed_Value_const&)>>
            (__return_storage_ptr__,&this->m_engine,(Boxed_Value *)auStack_28);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_28 + 8));
  return __return_storage_ptr__;
}

Assistant:

T eval(const std::string &t_input, const Exception_Handler &t_handler = Exception_Handler(), const std::string &t_filename = "__EVAL__") {
      return m_engine.boxed_cast<T>(eval(t_input, t_handler, t_filename));
    }